

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitileave.hpp
# Opt level: O0

ull_type bitmanip::detail::ileave_impl<unsigned_int,unsigned_int,unsigned_int,0ul,1ul,2ul>
                   (uint32_t param_1,uint32_t param_2,uint32_t param_3)

{
  uint64_t uVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  size_t max;
  uint args_local_2;
  uint args_local_1;
  uint args_local;
  
  uVar1 = ileaveZeros_const<2u,2u>(param_1);
  uVar2 = ileaveZeros_const<2u,1u>(param_2);
  uVar3 = ileaveZeros_const<2u,0u>(param_3);
  return uVar1 | uVar2 | uVar3;
}

Assistant:

[[nodiscard]] constexpr auto ileave_impl(std::index_sequence<I...>, Uint... args) noexcept -> ull_type
{
    constexpr std::size_t max = sizeof...(I) - 1;
    return (ileaveZeros_const<max, max - I>(args) | ...);
}